

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_fetch(connectdata *conn)

{
  void *pvVar1;
  char *local_58;
  char *local_40;
  IMAP *imap;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  if (*(long *)((long)pvVar1 + 0x18) == 0) {
    Curl_failf(conn->data,"Cannot FETCH without a UID.");
    conn_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    if (*(long *)((long)pvVar1 + 0x28) == 0) {
      if (*(long *)((long)pvVar1 + 0x20) == 0) {
        local_58 = "";
      }
      else {
        local_58 = *(char **)((long)pvVar1 + 0x20);
      }
      imap._4_4_ = imap_sendf(conn,"FETCH %s BODY[%s]",*(undefined8 *)((long)pvVar1 + 0x18),local_58
                             );
    }
    else {
      if (*(long *)((long)pvVar1 + 0x20) == 0) {
        local_40 = "";
      }
      else {
        local_40 = *(char **)((long)pvVar1 + 0x20);
      }
      imap._4_4_ = imap_sendf(conn,"FETCH %s BODY[%s]<%s>",*(undefined8 *)((long)pvVar1 + 0x18),
                              local_40,*(undefined8 *)((long)pvVar1 + 0x28));
    }
    if (imap._4_4_ == CURLE_OK) {
      state(conn,IMAP_FETCH);
    }
    conn_local._4_4_ = imap._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_perform_fetch(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = conn->data->req.protop;

  /* Check we have a UID */
  if(!imap->uid) {
    failf(conn->data, "Cannot FETCH without a UID.");
    return CURLE_URL_MALFORMAT;
  }

  /* Send the FETCH command */
  if(imap->partial)
    result = imap_sendf(conn, "FETCH %s BODY[%s]<%s>",
                        imap->uid,
                        imap->section ? imap->section : "",
                        imap->partial);
  else
    result = imap_sendf(conn, "FETCH %s BODY[%s]",
                        imap->uid,
                        imap->section ? imap->section : "");

  if(!result)
    state(conn, IMAP_FETCH);

  return result;
}